

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O2

void __thiscall cnn::ShadowParameters::ShadowParameters(ShadowParameters *this,Parameters *p)

{
  uint uVar1;
  float *pfVar2;
  
  Tensor::Tensor(&this->h,&p->values);
  uVar1 = Dim::size((Dim *)this);
  pfVar2 = (float *)cnn_mm_malloc((ulong)uVar1 << 2,0x100);
  (this->h).v = pfVar2;
  TensorTools::Zero(&this->h);
  return;
}

Assistant:

ShadowParameters::ShadowParameters(const Parameters& p) : h(p.values) {
  h.v = (float*)cnn_mm_malloc(h.d.size() * sizeof(float), 256);
  TensorTools::Zero(h);
}